

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledVertical.cpp
# Opt level: O0

void __thiscall
Rml::DecoratorTiledVertical::RenderElement
          (DecoratorTiledVertical *this,Element *element,DecoratorDataHandle element_data)

{
  long lVar1;
  long lVar2;
  CompiledShader local_68;
  Texture local_58;
  Vector2<float> local_48;
  int local_3c;
  Vector2f VStack_38;
  int i;
  DecoratorTiledVerticalData *data;
  Vector2<float> local_28;
  Vector2f translation;
  DecoratorDataHandle element_data_local;
  Element *element_local;
  DecoratorTiledVertical *this_local;
  
  translation = (Vector2f)element_data;
  data = (DecoratorTiledVerticalData *)Element::GetAbsoluteOffset(element,Padding);
  local_28 = Vector2<float>::Round((Vector2<float> *)&data);
  VStack_38 = translation;
  for (local_3c = 0; local_3c < *(int *)VStack_38; local_3c = local_3c + 1) {
    lVar1 = *(long *)((long)VStack_38 + 8);
    lVar2 = (long)local_3c;
    local_48 = local_28;
    local_58 = Decorator::GetTexture((Decorator *)this,local_3c);
    local_68.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.render_manager =
         (RenderManager *)0x0;
    local_68.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.resource_handle = 0
    ;
    CompiledShader::CompiledShader(&local_68);
    Geometry::Render((Geometry *)(lVar1 + lVar2 * 0x10),local_48,local_58,&local_68);
    CompiledShader::~CompiledShader(&local_68);
  }
  return;
}

Assistant:

void DecoratorTiledVertical::RenderElement(Element* element, DecoratorDataHandle element_data) const
{
	Vector2f translation = element->GetAbsoluteOffset(BoxArea::Padding).Round();
	DecoratorTiledVerticalData* data = reinterpret_cast<DecoratorTiledVerticalData*>(element_data);

	for (int i = 0; i < data->num_textures; i++)
		data->geometry[i].Render(translation, GetTexture(i));
}